

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O1

int archive_read_append_filter(archive *_a,int code)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *fmt;
  int iVar4;
  int64_t *piVar5;
  int64_t *piVar6;
  char str [20];
  char local_48 [24];
  
  uVar1 = code;
  switch(code) {
  case 0:
    break;
  case 1:
    builtin_strncpy(local_48,"gzip",5);
    uVar1 = archive_read_support_filter_gzip(_a);
    break;
  case 2:
    builtin_strncpy(local_48,"bzip2",6);
    uVar1 = archive_read_support_filter_bzip2(_a);
    break;
  case 3:
    builtin_strncpy(local_48 + 8," (.Z)",6);
    builtin_strncpy(local_48,"compress",8);
    uVar1 = archive_read_support_filter_compress(_a);
    break;
  case 4:
    fmt = "Cannot append program filter using archive_read_append_filter";
    goto LAB_0012304d;
  case 5:
    builtin_strncpy(local_48,"lzma",5);
    uVar1 = archive_read_support_filter_lzma(_a);
    break;
  case 6:
    local_48[2] = 0;
    local_48[0] = 'x';
    local_48[1] = 'z';
    uVar1 = archive_read_support_filter_xz(_a);
    break;
  case 7:
    local_48[2] = 0;
    local_48[0] = 'u';
    local_48[1] = 'u';
    uVar1 = archive_read_support_filter_uu(_a);
    break;
  case 8:
    builtin_strncpy(local_48,"rpm",4);
    uVar1 = archive_read_support_filter_rpm(_a);
    break;
  case 9:
    builtin_strncpy(local_48,"lzip",5);
    uVar1 = archive_read_support_filter_lzip(_a);
    break;
  case 10:
    builtin_strncpy(local_48,"lrzip",6);
    uVar1 = archive_read_support_filter_lrzip(_a);
    break;
  case 0xb:
    builtin_strncpy(local_48,"lzop",5);
    uVar1 = archive_read_support_filter_lzop(_a);
    break;
  default:
    fmt = "Invalid filter code specified";
    goto LAB_0012304d;
  case 0xd:
    builtin_strncpy(local_48,"lz4",4);
    uVar1 = archive_read_support_filter_lz4(_a);
    break;
  case 0xe:
    builtin_strncpy(local_48,"zstd",5);
    uVar1 = archive_read_support_filter_zstd(_a);
  }
  if (code != 0) {
    piVar5 = &_a[1].read_data_offset;
    iVar4 = 0xf;
    do {
      piVar6 = piVar5;
      if (((char *)piVar5[1] == (char *)0x0) ||
         (iVar2 = strcmp((char *)piVar5[1],local_48), iVar2 == 0)) break;
      piVar5 = piVar5 + 3;
      iVar4 = iVar4 + -1;
      piVar6 = (int64_t *)&_a[4].file_count;
    } while (iVar4 != 0);
    if (((char *)piVar6[1] == (char *)0x0) ||
       (iVar4 = strcmp((char *)piVar6[1],local_48), iVar4 != 0)) {
      fmt = "Internal error: Unable to append filter";
LAB_0012304d:
      iVar4 = 0x16;
    }
    else {
      pvVar3 = calloc(1,0x90);
      if (pvVar3 != (void *)0x0) {
        *(int64_t **)((long)pvVar3 + 8) = piVar6;
        *(archive **)((long)pvVar3 + 0x18) = _a;
        *(size_t *)((long)pvVar3 + 0x10) = _a[4].error_string.length;
        _a[4].error_string.length = (size_t)pvVar3;
        iVar4 = (**(code **)(piVar6[2] + 8))(pvVar3);
        if (iVar4 != 0) {
          __archive_read_free_filters((archive_read *)_a);
          return -0x1e;
        }
        goto LAB_001230aa;
      }
      fmt = "Out of memory";
      iVar4 = 0xc;
    }
    archive_set_error(_a,iVar4,fmt);
    return -0x1e;
  }
LAB_001230aa:
  *(undefined4 *)&_a[4].error_string.buffer_length = 1;
  return (int)uVar1 >> 0x1f & uVar1;
}

Assistant:

int
archive_read_append_filter(struct archive *_a, int code)
{
  int r1, r2, number_bidders, i;
  char str[20];
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  r2 = (ARCHIVE_OK);
  switch (code)
  {
    case ARCHIVE_FILTER_NONE:
      /* No filter to add, so do nothing.
       * NOTE: An initial "NONE" type filter is always set at the end of the
       * filter chain.
       */
      r1 = (ARCHIVE_OK);
      break;
    case ARCHIVE_FILTER_GZIP:
      strcpy(str, "gzip");
      r1 = archive_read_support_filter_gzip(_a);
      break;
    case ARCHIVE_FILTER_BZIP2:
      strcpy(str, "bzip2");
      r1 = archive_read_support_filter_bzip2(_a);
      break;
    case ARCHIVE_FILTER_COMPRESS:
      strcpy(str, "compress (.Z)");
      r1 = archive_read_support_filter_compress(_a);
      break;
    case ARCHIVE_FILTER_PROGRAM:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Cannot append program filter using archive_read_append_filter");
      return (ARCHIVE_FATAL);
    case ARCHIVE_FILTER_LZMA:
      strcpy(str, "lzma");
      r1 = archive_read_support_filter_lzma(_a);
      break;
    case ARCHIVE_FILTER_XZ:
      strcpy(str, "xz");
      r1 = archive_read_support_filter_xz(_a);
      break;
    case ARCHIVE_FILTER_UU:
      strcpy(str, "uu");
      r1 = archive_read_support_filter_uu(_a);
      break;
    case ARCHIVE_FILTER_RPM:
      strcpy(str, "rpm");
      r1 = archive_read_support_filter_rpm(_a);
      break;
    case ARCHIVE_FILTER_LZ4:
      strcpy(str, "lz4");
      r1 = archive_read_support_filter_lz4(_a);
      break;
    case ARCHIVE_FILTER_ZSTD:
      strcpy(str, "zstd");
      r1 = archive_read_support_filter_zstd(_a);
      break;
    case ARCHIVE_FILTER_LZIP:
      strcpy(str, "lzip");
      r1 = archive_read_support_filter_lzip(_a);
      break;
    case ARCHIVE_FILTER_LZOP:
      strcpy(str, "lzop");
      r1 = archive_read_support_filter_lzop(_a);
      break;
    case ARCHIVE_FILTER_LRZIP:
      strcpy(str, "lrzip");
      r1 = archive_read_support_filter_lrzip(_a);
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid filter code specified");
      return (ARCHIVE_FATAL);
  }

  if (code != ARCHIVE_FILTER_NONE)
  {
    number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

    bidder = a->bidders;
    for (i = 1; i < number_bidders; i++, bidder++)
    {
      if (!bidder->name || !strcmp(bidder->name, str))
        break;
    }
    if (!bidder->name || strcmp(bidder->name, str))
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Internal error: Unable to append filter");
      return (ARCHIVE_FATAL);
    }

    filter = calloc(1, sizeof(*filter));
    if (filter == NULL)
    {
      archive_set_error(&a->archive, ENOMEM, "Out of memory");
      return (ARCHIVE_FATAL);
    }
    filter->bidder = bidder;
    filter->archive = a;
    filter->upstream = a->filter;
    a->filter = filter;
    r2 = (bidder->vtable->init)(a->filter);
    if (r2 != ARCHIVE_OK) {
      __archive_read_free_filters(a);
      return (ARCHIVE_FATAL);
    }
  }

  a->bypass_filter_bidding = 1;
  return (r1 < r2) ? r1 : r2;
}